

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O0

StreamExecutionResult __thiscall
duckdb::BatchedBufferedData::ExecuteTaskInternal
          (BatchedBufferedData *this,StreamQueryResult *result,ClientContextLock *context_lock)

{
  bool bVar1;
  PendingExecutionResult value;
  PendingExecutionResult PVar2;
  undefined8 uVar3;
  BaseQueryResult *in_RSI;
  long *in_RDI;
  PendingExecutionResult execution_result;
  shared_ptr<duckdb::ClientContext,_true> cc;
  undefined1 in_stack_00000457;
  BaseQueryResult *in_stack_00000458;
  ClientContextLock *in_stack_00000460;
  ClientContext *in_stack_00000468;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff30;
  BatchedBufferedData *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  InternalException *in_stack_ffffffffffffffa0;
  StreamExecutionResult local_1;
  
  weak_ptr<duckdb::ClientContext,_true>::lock
            ((weak_ptr<duckdb::ClientContext,_true> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::ClientContext,_true> *)0x196a58a);
  if (bVar1) {
    value = BufferIsEmpty(in_stack_ffffffffffffff40);
    if ((bool)value) {
      (**(code **)(*in_RDI + 0x20))();
      shared_ptr<duckdb::ClientContext,_true>::operator->(in_stack_ffffffffffffff30);
      PVar2 = ClientContext::ExecuteTaskInternal
                        (in_stack_00000468,in_stack_00000460,in_stack_00000458,
                         (bool)in_stack_00000457);
      bVar1 = BufferIsEmpty(in_stack_ffffffffffffff40);
      if (bVar1) {
        if ((PVar2 == BLOCKED) || (PVar2 == RESULT_READY)) {
          local_1 = BLOCKED;
        }
        else {
          bVar1 = BaseQueryResult::HasError(in_RSI);
          if (bVar1) {
            BufferedData::Close((BufferedData *)0x196a6c7);
          }
          switch(PVar2) {
          case RESULT_NOT_READY:
          case NO_TASKS_AVAILABLE:
            local_1 = CHUNK_NOT_READY;
            break;
          case EXECUTION_ERROR:
            local_1 = EXECUTION_ERROR;
            break;
          default:
            uVar3 = __cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&stack0xffffffffffffff98,
                       "No conversion from PendingExecutionResult (%s) -> StreamExecutionResult",
                       (allocator *)&stack0xffffffffffffff97);
            EnumUtil::ToString<duckdb::PendingExecutionResult>(value);
            InternalException::InternalException<std::__cxx11::string>
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
                      );
            __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
          case EXECUTION_FINISHED:
            local_1 = EXECUTION_FINISHED;
          }
        }
      }
      else {
        local_1 = CHUNK_READY;
      }
    }
    else {
      local_1 = CHUNK_READY;
    }
  }
  else {
    local_1 = EXECUTION_CANCELLED;
  }
  shared_ptr<duckdb::ClientContext,_true>::~shared_ptr
            ((shared_ptr<duckdb::ClientContext,_true> *)0x196a844);
  return local_1;
}

Assistant:

StreamExecutionResult BatchedBufferedData::ExecuteTaskInternal(StreamQueryResult &result,
                                                               ClientContextLock &context_lock) {
	auto cc = context.lock();
	if (!cc) {
		return StreamExecutionResult::EXECUTION_CANCELLED;
	}

	if (!BufferIsEmpty()) {
		// The buffer isn't empty yet, just return
		return StreamExecutionResult::CHUNK_READY;
	}
	// Unblock any pending sinks if the buffer isnt full
	UnblockSinks();
	// Let the executor run until the buffer is no longer empty
	auto execution_result = cc->ExecuteTaskInternal(context_lock, result);
	if (!BufferIsEmpty()) {
		return StreamExecutionResult::CHUNK_READY;
	}
	if (execution_result == PendingExecutionResult::BLOCKED ||
	    execution_result == PendingExecutionResult::RESULT_READY) {
		return StreamExecutionResult::BLOCKED;
	}
	if (result.HasError()) {
		Close();
	}
	switch (execution_result) {
	case PendingExecutionResult::NO_TASKS_AVAILABLE:
	case PendingExecutionResult::RESULT_NOT_READY:
		return StreamExecutionResult::CHUNK_NOT_READY;
	case PendingExecutionResult::EXECUTION_FINISHED:
		return StreamExecutionResult::EXECUTION_FINISHED;
	case PendingExecutionResult::EXECUTION_ERROR:
		return StreamExecutionResult::EXECUTION_ERROR;
	default:
		throw InternalException("No conversion from PendingExecutionResult (%s) -> StreamExecutionResult",
		                        EnumUtil::ToString(execution_result));
	}
}